

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.h
# Opt level: O0

void __thiscall
llvm::yaml::IO::enumFallback<llvm::yaml::Hex8,llvm::dwarf::LineNumberOps>
          (IO *this,LineNumberOps *Val)

{
  uint uVar1;
  LineNumberOps *pLVar2;
  Hex8 local_1a;
  EmptyContext local_19;
  Hex8 Res;
  LineNumberOps *pLStack_18;
  EmptyContext Context;
  LineNumberOps *Val_local;
  IO *this_local;
  
  pLStack_18 = Val;
  uVar1 = (*this->_vptr_IO[0x16])();
  if ((uVar1 & 1) != 0) {
    Hex8::Hex8(&local_1a,*pLStack_18);
    yamlize<llvm::yaml::Hex8>(this,&local_1a,true,&local_19);
    pLVar2 = Hex8::operator_cast_to_unsigned_char_(&local_1a);
    *pLStack_18 = *pLVar2;
  }
  return;
}

Assistant:

void enumFallback(T &Val) {
    if (matchEnumFallback()) {
      EmptyContext Context;
      // FIXME: Force integral conversion to allow strong typedefs to convert.
      FBT Res = static_cast<typename FBT::BaseType>(Val);
      yamlize(*this, Res, true, Context);
      Val = static_cast<T>(static_cast<typename FBT::BaseType>(Res));
    }
  }